

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

void Imf_2_5::(anonymous_namespace)::checkIsNullTerminated<256ul>(char (*str) [256],char *what)

{
  long lVar1;
  ostream *poVar2;
  InputExc *this;
  stringstream s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  lVar1 = 0;
  do {
    if ((*str)[lVar1] == '\0') {
      return;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"Invalid ",8);
  poVar2 = std::operator<<(local_188,what);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": it is more than ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," characters long.",0x11);
  this = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this,(stringstream *)asStack_198);
  __cxa_throw(this,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void checkIsNullTerminated (const char (&str)[N], const char *what)
{
	for (size_t i = 0; i < N; ++i) {
		if (str[i] == '\0')
			return;
	}
	std::stringstream s;
	s << "Invalid " << what << ": it is more than " << (N - 1) 
		<< " characters long.";
	throw IEX_NAMESPACE::InputExc(s);
}